

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O0

DecoderResult *
ZXing::Pdf417::DecodeCodewords(vector<int,_std::allocator<int>_> *codewords,int numECCodeWords)

{
  bool bVar1;
  int *piVar2;
  DecoderResult *in_RDI;
  int *cw;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *in_stack_000001a8;
  int in_stack_000001b4;
  vector<int,_std::allocator<int>_> *in_stack_000001b8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff70;
  vector<int,_std::allocator<int>_> *this;
  vector<int,_std::allocator<int>_> local_58;
  int local_3c;
  reference local_38;
  int *local_30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28 [5];
  
  local_28[0]._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
  local_30 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff68);
    if (!bVar1) break;
    local_38 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(local_28);
    local_3c = 0;
    piVar2 = std::clamp<int>(local_38,&local_3c,&CodewordDecoder::MAX_CODEWORDS_IN_BARCODE);
    *local_38 = *piVar2;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (local_28);
  }
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = &local_58;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2cf6d5);
  DecodeCodewords(in_stack_000001b8,in_stack_000001b4,in_stack_000001a8);
  std::vector<int,_std::allocator<int>_>::~vector(this);
  return in_RDI;
}

Assistant:

DecoderResult DecodeCodewords(std::vector<int>& codewords, int numECCodeWords)
{
	for (auto& cw : codewords)
		cw = std::clamp(cw, 0, CodewordDecoder::MAX_CODEWORDS_IN_BARCODE);

	// erasures array has never been actually used inside the error correction code
	return DecodeCodewords(codewords, numECCodeWords, {});
}